

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O3

vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
* __thiscall
mario::TimerQueue::getExpired
          (vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           *__return_storage_ptr__,TimerQueue *this,Timestamp now)

{
  _Base_ptr p_Var1;
  pointer ppVar2;
  _Rb_tree_const_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_> __last;
  vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  *__range1;
  long lVar3;
  pointer ppVar4;
  _Rb_tree_const_iterator<std::pair<mario::Timestamp,_mario::Timer_*>_> _Var5;
  pair<std::_Rb_tree_iterator<std::pair<mario::Timer_*,_long>_>,_std::_Rb_tree_iterator<std::pair<mario::Timer_*,_long>_>_>
  pVar6;
  ActiveTimer timer;
  key_type local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  __last._M_node = &(this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (; p_Var1 != (_Base_ptr)0x0; p_Var1 = *(_Base_ptr *)((long)&p_Var1->_M_color + lVar3)) {
    if ((*(long *)(p_Var1 + 1) < now._microSecondsSinceEpoch) ||
       ((lVar3 = 0x10, _Var5._M_node = p_Var1, *(long *)(p_Var1 + 1) <= now._microSecondsSinceEpoch
        && (p_Var1[1]._M_parent != (_Base_ptr)0xffffffffffffffff)))) {
      lVar3 = 0x18;
      _Var5._M_node = __last._M_node;
    }
    __last._M_node = _Var5._M_node;
  }
  std::__copy_move<false,false,std::bidirectional_iterator_tag>::
  __copy_m<std::_Rb_tree_const_iterator<std::pair<mario::Timestamp,mario::Timer*>>,std::back_insert_iterator<std::vector<std::pair<mario::Timestamp,mario::Timer*>,std::allocator<std::pair<mario::Timestamp,mario::Timer*>>>>>
            ((this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,__last,
             (back_insert_iterator<std::vector<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>_>
              )__return_storage_ptr__);
  std::
  _Rb_tree<std::pair<mario::Timestamp,_mario::Timer_*>,_std::pair<mario::Timestamp,_mario::Timer_*>,_std::_Identity<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::less<std::pair<mario::Timestamp,_mario::Timer_*>_>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
  ::_M_erase_aux(&(this->_timers)._M_t,
                 (this->_timers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                 (const_iterator)__last._M_node);
  ppVar4 = (__return_storage_ptr__->
           super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->
           super__Vector_base<std::pair<mario::Timestamp,_mario::Timer_*>,_std::allocator<std::pair<mario::Timestamp,_mario::Timer_*>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar4 != ppVar2) {
    do {
      local_38.first = ppVar4->second;
      local_38.second = (local_38.first)->_sequence;
      pVar6 = std::
              _Rb_tree<std::pair<mario::Timer_*,_long>,_std::pair<mario::Timer_*,_long>,_std::_Identity<std::pair<mario::Timer_*,_long>_>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
              ::equal_range(&(this->_activeTimers)._M_t,&local_38);
      std::
      _Rb_tree<std::pair<mario::Timer_*,_long>,_std::pair<mario::Timer_*,_long>,_std::_Identity<std::pair<mario::Timer_*,_long>_>,_std::less<std::pair<mario::Timer_*,_long>_>,_std::allocator<std::pair<mario::Timer_*,_long>_>_>
      ::_M_erase_aux(&(this->_activeTimers)._M_t,(_Base_ptr)pVar6.first._M_node,
                     (_Base_ptr)pVar6.second._M_node);
      ppVar4 = ppVar4 + 1;
    } while (ppVar4 != ppVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TimerQueue::Entry> TimerQueue::getExpired(Timestamp now) {
    std::vector<Entry> expired;
    auto sentry = std::make_pair(now, reinterpret_cast<Timer*>(UINTPTR_MAX));
    auto it = _timers.lower_bound(sentry);
    std::copy(_timers.begin(), it, back_inserter(expired));
    _timers.erase(_timers.begin(), it);

    for (auto entry : expired) {
        ActiveTimer timer(entry.second, entry.second->sequence());
        auto n = _activeTimers.erase(timer);
    }

    return expired;
}